

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O1

int header_newc(archive_read *a,cpio *cpio,archive_entry *entry,size_t *namelength,size_t *name_pad)

{
  byte bVar1;
  bool bVar2;
  int *piVar3;
  char *pcVar4;
  dev_t dVar5;
  int64_t iVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  int *piVar14;
  int *piVar15;
  ulong uVar16;
  ssize_t bytes;
  long local_40;
  size_t *local_38;
  
  local_38 = namelength;
  piVar3 = (int *)__archive_read_ahead(a,0x6e,&local_40);
  iVar8 = -0x1e;
  bVar2 = true;
  if (piVar3 != (int *)0x0) {
    lVar11 = 0;
    do {
      if (((char)piVar3[1] == '0' && *piVar3 == 0x37303730) &&
         ((byte)(*(char *)((long)piVar3 + 5) - 0x31U) < 2)) {
        lVar10 = -0x6e;
        while ((bVar1 = *(byte *)((long)piVar3 + lVar10 + 0x6e), (byte)(bVar1 - 0x30) < 10 ||
               ((uVar12 = bVar1 - 0x41, uVar12 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)uVar12 & 0x3f) & 1) != 0))))) {
          lVar10 = lVar10 + 1;
          if (lVar10 == 0) goto LAB_004e9d4a;
        }
      }
      piVar14 = piVar3;
      if (0x6d < local_40) {
        piVar15 = piVar3;
        do {
          if (*(byte *)((long)piVar15 + 5) - 0x31 < 2) {
            lVar10 = 2;
            if ((char)piVar15[1] == '0' && *piVar15 == 0x37303730) {
              lVar13 = -0x6e;
              while ((bVar1 = *(byte *)((long)piVar15 + lVar13 + 0x6e), (byte)(bVar1 - 0x30) < 10 ||
                     ((uVar12 = bVar1 - 0x41, uVar12 < 0x26 &&
                      ((0x3f0000003fU >> ((ulong)uVar12 & 0x3f) & 1) != 0))))) {
                lVar13 = lVar13 + 1;
                if (lVar13 == 0) {
                  __archive_read_consume(a,(long)piVar15 - (long)piVar3);
                  uVar16 = ((long)piVar15 - (long)piVar3) + lVar11;
                  if (uVar16 == 0) goto LAB_004e9d4a;
                  archive_set_error(&a->archive,0,"Skipped %d bytes before finding valid header",
                                    uVar16 & 0xffffffff);
                  iVar8 = -0x14;
                  goto LAB_004e9d4f;
                }
              }
            }
          }
          else {
            lVar10 = 1;
            if (*(byte *)((long)piVar15 + 5) != 0x30) {
              lVar10 = 6;
            }
          }
          piVar14 = (int *)(lVar10 + (long)piVar15);
          uVar16 = (long)piVar15 + lVar10 + 0x6e;
          piVar15 = piVar14;
        } while (uVar16 <= (ulong)(local_40 + (long)piVar3));
      }
      __archive_read_consume(a,(long)piVar14 - (long)piVar3);
      lVar11 = lVar11 + ((long)piVar14 - (long)piVar3);
      piVar3 = (int *)__archive_read_ahead(a,0x6e,&local_40);
    } while (piVar3 != (int *)0x0);
    iVar8 = -0x1e;
  }
LAB_004e9d5d:
  if (bVar2) {
    return iVar8;
  }
  piVar3 = (int *)__archive_read_ahead(a,0x6e,(ssize_t *)0x0);
  if (piVar3 == (int *)0x0) {
    return -0x1e;
  }
  if ((short)piVar3[1] == 0x3130 && *piVar3 == 0x37303730) {
    pcVar4 = "ASCII cpio (SVR4 with no CRC)";
    iVar9 = 0x10004;
  }
  else {
    if ((short)piVar3[1] != 0x3230 || *piVar3 != 0x37303730) goto LAB_004e9dda;
    pcVar4 = "ASCII cpio (SVR4 with CRC)";
    iVar9 = 0x10005;
  }
  (a->archive).archive_format = iVar9;
  (a->archive).archive_format_name = pcVar4;
LAB_004e9dda:
  dVar5 = atol16((char *)((long)piVar3 + 0x3e),8);
  archive_entry_set_devmajor(entry,dVar5);
  dVar5 = atol16((char *)((long)piVar3 + 0x46),8);
  archive_entry_set_devminor(entry,dVar5);
  iVar6 = atol16((char *)((long)piVar3 + 6),8);
  archive_entry_set_ino(entry,iVar6);
  iVar6 = atol16((char *)((long)piVar3 + 0xe),8);
  archive_entry_set_mode(entry,(mode_t)iVar6);
  iVar6 = atol16((char *)((long)piVar3 + 0x16),8);
  archive_entry_set_uid(entry,iVar6);
  iVar6 = atol16((char *)((long)piVar3 + 0x1e),8);
  archive_entry_set_gid(entry,iVar6);
  iVar6 = atol16((char *)((long)piVar3 + 0x26),8);
  archive_entry_set_nlink(entry,(uint)iVar6);
  dVar5 = atol16((char *)((long)piVar3 + 0x4e),8);
  archive_entry_set_rdevmajor(entry,dVar5);
  dVar5 = atol16((char *)((long)piVar3 + 0x56),8);
  archive_entry_set_rdevminor(entry,dVar5);
  iVar6 = atol16((char *)((long)piVar3 + 0x2e),8);
  archive_entry_set_mtime(entry,iVar6,0);
  sVar7 = atol16((char *)((long)piVar3 + 0x5e),8);
  *local_38 = sVar7;
  *name_pad = (ulong)(2U - (int)sVar7 & 3);
  iVar6 = atol16((char *)((long)piVar3 + 0x36),8);
  cpio->entry_bytes_remaining = iVar6;
  archive_entry_set_size(entry,iVar6);
  cpio->entry_padding = (ulong)(-(int)cpio->entry_bytes_remaining & 3);
  __archive_read_consume(a,0x6e);
  return iVar8;
LAB_004e9d4a:
  iVar8 = 0;
LAB_004e9d4f:
  bVar2 = false;
  goto LAB_004e9d5d;
}

Assistant:

static int
header_newc(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	const char *header;
	int r;

	r = find_newc_header(a);
	if (r < ARCHIVE_WARN)
		return (r);

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, newc_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out hex fields. */
	header = (const char *)h;

	if (memcmp(header + newc_magic_offset, "070701", 6) == 0) {
		a->archive.archive_format = ARCHIVE_FORMAT_CPIO_SVR4_NOCRC;
		a->archive.archive_format_name = "ASCII cpio (SVR4 with no CRC)";
	} else if (memcmp(header + newc_magic_offset, "070702", 6) == 0) {
		a->archive.archive_format = ARCHIVE_FORMAT_CPIO_SVR4_CRC;
		a->archive.archive_format_name = "ASCII cpio (SVR4 with CRC)";
	} else {
		/* TODO: Abort here? */
	}

	archive_entry_set_devmajor(entry,
		(dev_t)atol16(header + newc_devmajor_offset, newc_devmajor_size));
	archive_entry_set_devminor(entry, 
		(dev_t)atol16(header + newc_devminor_offset, newc_devminor_size));
	archive_entry_set_ino(entry, atol16(header + newc_ino_offset, newc_ino_size));
	archive_entry_set_mode(entry, 
		(mode_t)atol16(header + newc_mode_offset, newc_mode_size));
	archive_entry_set_uid(entry, atol16(header + newc_uid_offset, newc_uid_size));
	archive_entry_set_gid(entry, atol16(header + newc_gid_offset, newc_gid_size));
	archive_entry_set_nlink(entry,
		(unsigned int)atol16(header + newc_nlink_offset, newc_nlink_size));
	archive_entry_set_rdevmajor(entry,
		(dev_t)atol16(header + newc_rdevmajor_offset, newc_rdevmajor_size));
	archive_entry_set_rdevminor(entry,
		(dev_t)atol16(header + newc_rdevminor_offset, newc_rdevminor_size));
	archive_entry_set_mtime(entry, atol16(header + newc_mtime_offset, newc_mtime_size), 0);
	*namelength = (size_t)atol16(header + newc_namesize_offset, newc_namesize_size);
	/* Pad name to 2 more than a multiple of 4. */
	*name_pad = (2 - *namelength) & 3;

	/*
	 * Note: entry_bytes_remaining is at least 64 bits and
	 * therefore guaranteed to be big enough for a 33-bit file
	 * size.
	 */
	cpio->entry_bytes_remaining =
	    atol16(header + newc_filesize_offset, newc_filesize_size);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	/* Pad file contents to a multiple of 4. */
	cpio->entry_padding = 3 & -cpio->entry_bytes_remaining;
	__archive_read_consume(a, newc_header_size);
	return (r);
}